

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::bitfield_insert_invalid_bits_type
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderType shaderType_00;
  DataType offsetDataType;
  bool bVar1;
  char *__s;
  long lVar2;
  long lVar3;
  long lVar4;
  DataType in_stack_ffffffffffffff30;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"bitfieldInsert: Invalid bits type.",
             (allocator<char> *)&local_90);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    shaderType = (&(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,__s,(allocator<char> *)&stack0xffffffffffffff33);
      std::operator+(&shaderSource,"Verify shader: ",&local_90);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_90);
      for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
        shaderType_00 = (&(anonymous_namespace)::s_intTypes)[lVar2];
        for (lVar3 = 0; lVar3 != 0x2c; lVar3 = lVar3 + 4) {
          offsetDataType = *(DataType *)((long)&(anonymous_namespace)::s_nonScalarIntTypes + lVar3);
          (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,shaderType_00,shaderType_00,TYPE_INT,
                     offsetDataType,in_stack_ffffffffffffff30);
          std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,
                     (&(anonymous_namespace)::s_uintTypes)[lVar2],
                     (&(anonymous_namespace)::s_uintTypes)[lVar2],TYPE_INT,offsetDataType,
                     in_stack_ffffffffffffff30);
          std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
      }
      NegativeTestContext::endSection(ctx);
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void bitfield_insert_invalid_bits_type (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_intTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("bitfieldInsert: Invalid bits type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_nonScalarIntTypes); ++dataTypeNdx2)
				{
					{
						const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx], glu::TYPE_INT, s_nonScalarIntTypes[dataTypeNdx2]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], glu::TYPE_INT, s_nonScalarIntTypes[dataTypeNdx2]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}